

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleInterpolationTests.cpp
# Opt level: O2

TestInstance * __thiscall
vkt::pipeline::multisample::
MSCase<vkt::pipeline::multisample::MSCaseCentroidQualifierInsidePrimitive>::createInstance
          (MSCase<vkt::pipeline::multisample::MSCaseCentroidQualifierInsidePrimitive> *this,
          Context *context)

{
  TestInstance *this_00;
  
  this_00 = (TestInstance *)operator_new(0x30);
  MSInstance<vkt::pipeline::multisample::MSInstanceInterpolateBarycentricCoordinates>::MSInstance
            ((MSInstance<vkt::pipeline::multisample::MSInstanceInterpolateBarycentricCoordinates> *)
             this_00,context,&(this->super_MultisampleCaseBase).m_imageMSParams);
  return this_00;
}

Assistant:

TestInstance* MSCase<MSCaseCentroidQualifierInsidePrimitive>::createInstance (Context& context) const
{
	return new MSInstance<MSInstanceInterpolateBarycentricCoordinates>(context, m_imageMSParams);
}